

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::reducev
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  uint16_t uVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  
  switch(dt) {
  case dt_uint8:
    if (vw * sstride != 0) {
      pvVar2 = (void *)((long)(vw * sstride) + (long)src);
      iVar3 = nchan * uw;
      do {
        if (iVar3 != 0) {
          lVar4 = 0;
          do {
            *(char *)((long)dst + lVar4) =
                 (char)((uint)*(byte *)((long)src + lVar4 + sstride) +
                        (uint)*(byte *)((long)src + lVar4) >> 1);
            lVar4 = lVar4 + 1;
          } while (iVar3 != lVar4);
          dst = (void *)((long)dst + lVar4);
          src = (void *)((long)src + (long)iVar3);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar3));
        src = (void *)((long)src + (long)(sstride * 2 - iVar3));
      } while (src != pvVar2);
    }
    break;
  case dt_uint16:
    iVar3 = sstride / 2;
    if (vw * iVar3 != 0) {
      pvVar2 = (void *)((long)src + (long)(vw * iVar3) * 2);
      iVar5 = nchan * uw;
      do {
        if (iVar5 != 0) {
          lVar4 = 0;
          do {
            *(short *)((long)dst + lVar4) =
                 (short)((uint)*(ushort *)((long)src + lVar4 + (long)iVar3 * 2) +
                         (uint)*(ushort *)((long)src + lVar4) >> 1);
            lVar4 = lVar4 + 2;
          } while ((long)iVar5 * 2 != lVar4);
          dst = (void *)((long)dst + lVar4);
          src = (void *)((long)src + (long)iVar5 * 2);
        }
        src = (void *)((long)src + (long)(iVar3 * 2 - iVar5) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar5) * 2);
      } while (src != pvVar2);
    }
    break;
  case dt_half:
    iVar3 = sstride / 2;
    if (vw * iVar3 != 0) {
      pvVar2 = (void *)((long)src + (long)(vw * iVar3) * 2);
      iVar5 = nchan * uw;
      do {
        pvVar7 = src;
        if (iVar5 != 0) {
          pvVar7 = (void *)((long)src + (long)iVar5 * 2);
          lVar4 = 0;
          do {
            uVar1 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                   (ulong)*(ushort *)((long)src + lVar4) * 4) +
                                        *(float *)(PtexHalf::h2fTable +
                                                  (ulong)*(ushort *)
                                                          ((long)src + lVar4 + (long)iVar3 * 2) * 4)
                                        ) * 0.5);
            *(uint16_t *)((long)dst + lVar4) = uVar1;
            lVar4 = lVar4 + 2;
          } while ((long)iVar5 * 2 != lVar4);
          dst = (void *)((long)dst + lVar4);
        }
        src = (void *)((long)pvVar7 + (long)(iVar3 * 2 - iVar5) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar5) * 2);
      } while (src != pvVar2);
    }
    break;
  case dt_float:
    iVar3 = sstride + 3;
    if (-1 < sstride) {
      iVar3 = sstride;
    }
    iVar3 = iVar3 >> 2;
    if (vw * iVar3 != 0) {
      pvVar2 = (void *)((long)src + (long)(vw * iVar3) * 4);
      iVar5 = dstride + 3;
      if (-1 < dstride) {
        iVar5 = dstride;
      }
      iVar6 = nchan * uw;
      do {
        if (iVar6 != 0) {
          lVar4 = 0;
          do {
            *(float *)((long)dst + lVar4) =
                 (*(float *)((long)src + lVar4) + *(float *)((long)src + lVar4 + (long)iVar3 * 4)) *
                 0.5;
            lVar4 = lVar4 + 4;
          } while ((long)iVar6 * 4 - lVar4 != 0);
          dst = (void *)((long)dst + lVar4);
          src = (void *)((long)src + (long)iVar6 * 4);
        }
        src = (void *)((long)src + (long)(iVar3 * 2 - iVar6) * 4);
        dst = (void *)((long)dst + (long)((iVar5 >> 2) - iVar6) * 4);
      } while (src != pvVar2);
    }
  }
  return;
}

Assistant:

void reducev(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reducev(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reducev(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reducev(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reducev(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}